

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtmg(fitsfile *infptr,fitsfile *outfptr,int mgopt,int *status)

{
  int iVar1;
  int iVar2;
  long member;
  fitsfile *tmpfptr;
  int local_3c;
  long nmembers;
  
  nmembers = 0;
  tmpfptr = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    local_3c = mgopt;
    iVar1 = ffgtnm(infptr,&nmembers,status);
    *status = iVar1;
    for (member = 1; member <= nmembers; member = member + 1) {
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = ffgmop(infptr,member,&tmpfptr,status);
      *status = iVar1;
      iVar2 = ffgtam(outfptr,tmpfptr,0,status);
      iVar1 = 0;
      if (iVar2 != 0x155) {
        iVar1 = iVar2;
      }
      *status = iVar1;
      if (tmpfptr != (fitsfile *)0x0) {
        ffclos(tmpfptr,status);
        tmpfptr = (fitsfile *)0x0;
        iVar1 = *status;
      }
    }
    if ((local_3c == 1) && (iVar1 == 0)) {
      iVar1 = ffgtrm(infptr,0,status);
      *status = iVar1;
      if (tmpfptr != (fitsfile *)0x0) {
        ffclos(tmpfptr,status);
        iVar1 = *status;
      }
    }
  }
  return iVar1;
}

Assistant:

int ffgtmg(fitsfile *infptr,  /* FITS file ptr to source grouping table      */
	   fitsfile *outfptr, /* FITS file ptr to target grouping table      */
	   int       mgopt,   /* code specifying merge options:
				 OPT_MRG_COPY (0) ==> copy members to target
				                      group, leaving source 
						      group in place
				 OPT_MRG_MOV  (1) ==> move members to target
				                      group, source group is
						      deleted after merge    */
	   int      *status)   /* return status code                         */
     

/*
  merge two grouping tables by combining their members into a single table. 
  The source grouping table must be the CHDU of the fitsfile pointed to by 
  infptr, and the target grouping table must be the CHDU of the fitsfile to by 
  outfptr. All members of the source grouping table shall be copied to the
  target grouping table. If the mgopt parameter is OPT_MRG_COPY then the source
  grouping table continues to exist after the merge. If the mgopt parameter
  is OPT_MRG_MOV then the source grouping table is deleted after the merge, 
  and all member HDUs are updated accordingly.
*/
{
  long i ;
  long nmembers = 0;

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {

      *status = fits_get_num_members(infptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(infptr,i,&tmpfptr,status);
	  *status = fits_add_group_member(outfptr,tmpfptr,0,status);

	  if(*status == HDU_ALREADY_MEMBER) *status = 0;

	  if(tmpfptr != NULL)
	    {
	      fits_close_file(tmpfptr,status);
	      tmpfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      if(mgopt == OPT_MRG_MOV) 
	*status = fits_remove_group(infptr,OPT_RM_GPT,status);

    }while(0);

  if(tmpfptr != NULL)
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}